

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWRepository.cxx
# Opt level: O1

bool __thiscall cmCPackIFWRepository::PatchUpdatesXml(cmCPackIFWRepository *this)

{
  pointer pcVar1;
  bool bVar2;
  string updatesPatchXml;
  string updatesXml;
  cmXMLWriter xout;
  cmCPackeIFWUpdatesPatcher patcher;
  cmGeneratedFileStream fout;
  string local_340;
  string local_320;
  cmXMLWriter local_300;
  cmXMLParser local_2a8;
  cmCPackIFWRepository *local_280;
  cmXMLWriter *local_278;
  undefined1 local_270;
  cmGeneratedFileStream local_268;
  
  if (((this->Directory)._M_string_length == 0) &&
     ((this->super_cmCPackIFWCommon).Generator != (cmCPackIFWGenerator *)0x0)) {
    std::__cxx11::string::_M_assign((string *)&this->Directory);
  }
  pcVar1 = (this->Directory)._M_dataplus._M_p;
  local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_320,pcVar1,pcVar1 + (this->Directory)._M_string_length);
  std::__cxx11::string::append((char *)&local_320);
  pcVar1 = (this->Directory)._M_dataplus._M_p;
  local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_340,pcVar1,pcVar1 + (this->Directory)._M_string_length);
  std::__cxx11::string::append((char *)&local_340);
  cmGeneratedFileStream::cmGeneratedFileStream(&local_268,&local_340,false,None);
  cmXMLWriter::cmXMLWriter(&local_300,(ostream *)&local_268,0);
  cmXMLWriter::StartDocument(&local_300,"UTF-8");
  cmCPackIFWCommon::WriteGeneratedByToStrim(&this->super_cmCPackIFWCommon,&local_300);
  cmXMLParser::cmXMLParser(&local_2a8);
  local_2a8._vptr_cmXMLParser = (_func_int **)&PTR__cmXMLParser_006a2448;
  local_270 = 0;
  local_280 = this;
  local_278 = &local_300;
  cmXMLParser::ParseFile(&local_2a8,local_320._M_dataplus._M_p);
  cmXMLParser::~cmXMLParser(&local_2a8);
  cmXMLWriter::EndDocument(&local_300);
  cmGeneratedFileStream::Close(&local_268);
  bVar2 = cmSystemTools::RenameFile(&local_340,&local_320);
  cmXMLWriter::~cmXMLWriter(&local_300);
  cmGeneratedFileStream::~cmGeneratedFileStream(&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool cmCPackIFWRepository::PatchUpdatesXml()
{
  // Lazy directory initialization
  if (this->Directory.empty() && this->Generator) {
    this->Directory = this->Generator->toplevel;
  }

  // Filenames
  std::string updatesXml = this->Directory + "/repository/Updates.xml";
  std::string updatesPatchXml =
    this->Directory + "/repository/UpdatesPatch.xml";

  // Output stream
  cmGeneratedFileStream fout(updatesPatchXml);
  cmXMLWriter xout(fout);

  xout.StartDocument();

  this->WriteGeneratedByToStrim(xout);

  // Patch
  {
    cmCPackeIFWUpdatesPatcher patcher(this, xout);
    patcher.ParseFile(updatesXml.data());
  }

  xout.EndDocument();

  fout.Close();

  return cmSystemTools::RenameFile(updatesPatchXml, updatesXml);
}